

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::Tracer_testPropagation_Test::TestBody(Tracer_testPropagation_Test *this)

{
  uint64_t *puVar1;
  byte bVar2;
  undefined8 uVar3;
  uint64_t rhs;
  undefined8 uVar4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  char cVar6;
  int iVar7;
  undefined8 uVar8;
  SpanContext *pSVar9;
  iterator iVar10;
  long *plVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  __it;
  uint64_t *puVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  internal iVar19;
  AssertionResult *this_00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var20;
  __buckets_ptr pp_Var21;
  _func_int **pp_Var22;
  char *pcVar23;
  pointer __old_p;
  pointer __old_p_2;
  ReaderMock<opentracing::v3::TextMapReader> textReader;
  AssertionResult gtest_ar__5;
  FakeSpanContext fakeCtx;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  WriterMock<opentracing::v3::HTTPHeadersWriter> headerWriter;
  ReaderMock<opentracing::v3::HTTPHeadersReader> headerReader;
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  result;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  stringstream ss;
  _Head_base<0UL,_opentracing::v3::SpanContext_*,_false> local_520;
  undefined1 local_518 [32];
  AssertHelper local_4f8 [8];
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  local_4f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_4d8;
  uchar local_499;
  undefined1 local_498 [32];
  float local_478;
  size_t local_470;
  undefined1 auStack_468 [8];
  undefined1 local_460 [40];
  __buckets_ptr local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  undefined **local_3a0;
  undefined1 *local_398;
  undefined1 local_38a;
  undefined1 local_389;
  undefined **local_388;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_380;
  SpanContext local_378;
  uint64_t local_2c8;
  uint64_t local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  char *local_2b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  AssertionResult local_298;
  void *local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  avStack_270 [3];
  ios_base local_228 [16];
  ios_base local_218 [264];
  undefined1 local_110 [24];
  undefined1 local_f8 [24];
  SpanContext local_e0;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  sVar5.ptr_ = local_298.message_.ptr_;
  uVar4 = local_298._0_8_;
  if (local_298.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_298.message_.ptr_)->_M_string_length =
           (int)(local_298.message_.ptr_)->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_298.message_.ptr_)->_M_string_length =
           (int)(local_298.message_.ptr_)->_M_string_length + 1;
    }
  }
  if (local_298.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.message_.ptr_);
  }
  avStack_270[0].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_270[0].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278 = 0;
  avStack_270[0].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288 = (void *)0x0;
  uStack_280 = 0;
  local_298._0_8_ = (void **)0x0;
  local_298.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  (**(code **)((long)*(void **)uVar4 + 0x10))(local_460,uVar4,"test-inject",0xb,&local_298);
  uVar3 = local_460._0_8_;
  local_460._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ::~vector(avStack_270);
  if (local_288 != (void *)0x0) {
    operator_delete(local_288);
  }
  (*(code *)(*(__node_base_ptr *)uVar3)[5]._M_nxt)
            (uVar3,"test-baggage-item-key",0x15,"test baggage item value",0x17);
  local_2b8 = sVar5.ptr_;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_298);
  uVar8 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
  (**(code **)((long)*(void **)uVar4 + 0x18))(local_460,uVar4,uVar8,&local_288);
  local_378.super_SpanContext._vptr_SpanContext._0_1_ = local_460[0];
  local_378._traceID._high = 0;
  if (local_460[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_498);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_460,(char *)&local_378,
               "static_cast<bool>(tracer->Inject(span->context(), ss))","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x15c,(char *)local_460._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_460 + 0x10)) {
      operator_delete((void *)local_460._0_8_);
    }
    if ((SpanContext *)local_498._0_8_ != (SpanContext *)0x0) {
      cVar6 = testing::internal::IsTrue(true);
      if ((cVar6 != '\0') && ((SpanContext *)local_498._0_8_ != (SpanContext *)0x0)) {
        (**(code **)(*(long *)local_498._0_8_ + 8))();
      }
      local_498._0_8_ = (SpanContext *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_378._traceID,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_378._traceID,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    (**(code **)((long)*(void **)uVar4 + 0x38))(&local_378,uVar4,&local_298);
    local_498[0] = (Message)local_378.super_SpanContext._vptr_SpanContext._0_1_;
    local_498._8_8_ = (SpanContext *)0x0;
    if (local_378.super_SpanContext._vptr_SpanContext._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)local_460,local_498,"static_cast<bool>(result)","false");
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_518,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x15e,(char *)local_460._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_518,(Message *)&local_4d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_460 + 0x10)) {
        operator_delete((void *)local_460._0_8_);
      }
      if ((SpanContext *)local_4d8._M_buckets != (SpanContext *)0x0) {
        cVar6 = testing::internal::IsTrue(true);
        if ((cVar6 != '\0') && ((SpanContext *)local_4d8._M_buckets != (SpanContext *)0x0)) {
          (*((SpanContext *)local_4d8._M_buckets)->_vptr_SpanContext[1])();
        }
        local_4d8._M_buckets = (__buckets_ptr)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_498 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_378.super_SpanContext._vptr_SpanContext._0_1_ == (internal)0x0) goto LAB_0019046f;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_498 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      rhs = local_378._traceID._high;
      if (local_378.super_SpanContext._vptr_SpanContext._0_1_ == (internal)0x0) goto LAB_00191eb7;
      local_378._traceID._high = 0;
      local_498[0] = (Message)((SpanContext *)rhs != (SpanContext *)0x0);
      local_498._8_8_ = (SpanContext *)0x0;
      if ((SpanContext *)rhs == (SpanContext *)0x0) {
        testing::Message::Message((Message *)&local_4d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_460,local_498,"static_cast<bool>(extractedCtx)","false")
        ;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_518,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                   ,0x161,(char *)local_460._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_518,(Message *)&local_4d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_460 + 0x10)) {
          operator_delete((void *)local_460._0_8_);
        }
        if ((SpanContext *)local_4d8._M_buckets != (SpanContext *)0x0) {
          cVar6 = testing::internal::IsTrue(true);
          if ((cVar6 != '\0') && ((SpanContext *)local_4d8._M_buckets != (SpanContext *)0x0)) {
            (*((SpanContext *)local_4d8._M_buckets)->_vptr_SpanContext[1])();
          }
          local_4d8._M_buckets = (__buckets_ptr)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_498 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_498 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pSVar9 = (SpanContext *)(*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
        testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                  ((internal *)local_460,"span->context()","*extractedCtx",pSVar9,(SpanContext *)rhs
                  );
        if (local_460[0] != (internal)0x0) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_460 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_4d8._M_buckets = (__buckets_ptr)&PTR__SpanContext_0020dd80;
          std::ios::clear((int)&local_298 + (int)*(void **)(local_298._0_8_ + -0x18));
          local_460._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_460 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"");
          std::__cxx11::stringbuf::str((string *)&uStack_280);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_460 + 0x10)) {
            operator_delete((void *)local_460._0_8_);
          }
          (**(code **)((long)*(void **)uVar4 + 0x18))(local_460,uVar4,&local_4d8,&local_288);
          iVar19 = local_460[0];
          local_498._0_8_ = CONCAT71(local_498._1_7_,local_460[0]) ^ 1;
          local_498._8_8_ = (SpanContext *)0x0;
          if (local_460[0] == (internal)0x0) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_498 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::Message::Message((Message *)local_518);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)local_460,local_498,
                       "static_cast<bool>(tracer->Inject(fakeCtx, ss))","true");
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                       ,0x166,(char *)local_460._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4f0,(Message *)local_518);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_460 + 0x10)) {
              operator_delete((void *)local_460._0_8_);
            }
            if ((SpanContext *)local_518._0_8_ != (SpanContext *)0x0) {
              cVar6 = testing::internal::IsTrue(true);
              if ((cVar6 != '\0') && ((SpanContext *)local_518._0_8_ != (SpanContext *)0x0)) {
                (**(code **)(*(undefined **)local_518._0_8_ + 8))();
              }
              local_518._0_8_ = (SpanContext *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_498 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          (*((SpanContext *)rhs)->_vptr_SpanContext[1])(rhs);
          if (local_378.super_SpanContext._vptr_SpanContext._0_1_ == (internal)0x1) {
            if ((SpanContext *)local_378._traceID._high != (SpanContext *)0x0) {
              (*((SpanContext *)local_378._traceID._high)->_vptr_SpanContext[1])();
            }
            local_378._traceID._high = 0;
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_298);
          std::ios_base::~ios_base(local_218);
          if (iVar19 != (internal)0x0) goto LAB_00190490;
          local_460._0_8_ = &aStack_430;
          local_460._8_8_ =
               (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                )0x1;
          local_460._16_8_ = (_Hash_node_base *)0x0;
          local_460._24_8_ = (uint64_t *)0x0;
          local_460._32_4_ = 1.0;
          local_438 = (__buckets_ptr)0x0;
          aStack_430._M_allocated_capacity = 0;
          local_4d8._M_buckets = (__buckets_ptr)&PTR__TextMapWriter_0020de60;
          local_4d8._M_bucket_count = (size_type)local_460;
          uVar8 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
          (**(code **)((long)*(void **)uVar4 + 0x20))(&local_298,uVar4,uVar8,&local_4d8);
          local_378.super_SpanContext._vptr_SpanContext._0_1_ = (internal)local_298.success_;
          local_378._traceID._high = 0;
          if ((stringstream)local_298.success_ == (stringstream)0x0) {
            testing::Message::Message((Message *)local_498);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_298,(char *)&local_378,
                       "static_cast<bool>(tracer->Inject(span->context(), textWriter))","false");
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_518,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                       ,0x16e,(char *)local_298._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_518,(Message *)local_498);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
            if ((void **)local_298._0_8_ != &local_288) {
              operator_delete((void *)local_298._0_8_);
            }
            if ((SpanContext *)local_498._0_8_ != (SpanContext *)0x0) {
              cVar6 = testing::internal::IsTrue(true);
              if ((cVar6 != '\0') && ((SpanContext *)local_498._0_8_ != (SpanContext *)0x0)) {
                (**(code **)(*(long *)local_498._0_8_ + 8))();
              }
              local_498._0_8_ = (SpanContext *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_378._traceID,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_00190a55:
            p_Var20 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_460;
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_378._traceID,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_498._0_4_ = 2;
            local_378.super_SpanContext._vptr_SpanContext = (_func_int **)local_460._24_8_;
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)&local_298,"2","textMap.size()",(int *)local_498,
                       (unsigned_long *)&local_378);
            if ((stringstream)local_298.success_ == (stringstream)0x0) {
              testing::Message::Message((Message *)&local_378);
              pcVar23 = "";
              if (local_298.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar23 = ((local_298.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_498,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x16f,pcVar23);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_498,(Message *)&local_378);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
              if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)0x0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') &&
                   (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)0x0)) {
                  (**(code **)(*local_378.super_SpanContext._vptr_SpanContext + 8))();
                }
                local_378.super_SpanContext._vptr_SpanContext = (_func_int **)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_298.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_00190a55;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_298.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298);
            pSVar9 = (SpanContext *)(*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
            SpanContext::print<std::ostream>
                      (pSVar9,(basic_ostream<char,_std::char_traits<char>_> *)&local_298);
            std::__cxx11::stringbuf::str();
            uVar8 = (long)local_498 + 0x10;
            local_498._0_8_ = uVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"uber-trace-id","");
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_460,(key_type *)local_498);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
LAB_001921b8:
              testing::Message::Message((Message *)local_518);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_460,(char *)&local_4d8,
                         "static_cast<bool>(extractedCtx)","false");
              testing::internal::AssertHelper::AssertHelper
                        (local_4f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x1cb,(char *)local_460._0_8_);
              testing::internal::AssertHelper::operator=(local_4f8,(Message *)local_518);
LAB_0019204d:
              testing::internal::AssertHelper::~AssertHelper(local_4f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_460 + 0x10)) {
                operator_delete((void *)local_460._0_8_);
              }
              testing::Message::~Message((Message *)local_518);
              p_Var20 = &local_4d8;
LAB_001920cf:
              testing::AssertionResult::~AssertionResult((AssertionResult *)p_Var20);
              iVar19 = (internal)0x0;
              local_520._M_head_impl = (SpanContext *)uVar8;
LAB_001920db:
              SpanContext::~SpanContext(&local_378);
LAB_00191d02:
              if ((SpanContext *)local_520._M_head_impl != (SpanContext *)0x0) {
                (*((SpanContext *)&(local_520._M_head_impl)->_vptr_SpanContext)->_vptr_SpanContext
                  [1])(local_520._M_head_impl);
              }
              if ((Message)local_4f0.has_value_ == (Message)0x1) {
                if (local_4f0.contained.m_value._M_t.
                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                     )0x0) {
                  (*(*(_func_int ***)
                      local_4f0.contained.m_value._M_t.
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl)[1]
                  )();
                }
                local_4f0.contained.m_value._M_t.
                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                ._M_t.
                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                     (value_type)
                     (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                      )0x0;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298);
              std::ios_base::~ios_base(local_228);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_498);
              if (iVar19 != (internal)0x0) {
                (**(code **)((long)*(void **)uVar4 + 0x58))(uVar4);
              }
              goto LAB_00190490;
            }
            testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                      ((internal *)local_518,"oss.str()","textMap.at(kTraceContextHeaderName)",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)iVar10.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur + 0x28));
            if (local_498._0_8_ != uVar8) {
              operator_delete((void *)local_498._0_8_);
            }
            puVar1 = &local_378._traceID._low;
            if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
              operator_delete(local_378.super_SpanContext._vptr_SpanContext);
            }
            if (local_518[0] == (Message)0x0) {
              testing::Message::Message((Message *)&local_378);
              if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_518._8_8_ ==
                  (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)0x0) {
                pp_Var21 = (__buckets_ptr)0x1e6ee4;
              }
              else {
                pp_Var21 = *(__buckets_ptr *)local_518._8_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_498,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x172,(char *)pp_Var21);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_498,(Message *)&local_378);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
              if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)0x0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') &&
                   (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)0x0)) {
                  (**(code **)(*local_378.super_SpanContext._vptr_SpanContext + 8))();
                }
                local_378.super_SpanContext._vptr_SpanContext = (_func_int **)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_518 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_00190a34;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_518 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_498._0_8_ = uVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"uberctx-","");
            plVar11 = (long *)std::__cxx11::string::append(local_498);
            puVar17 = (uint64_t *)(plVar11 + 2);
            if ((uint64_t *)*plVar11 == puVar17) {
              local_378._traceID._low = *puVar17;
              local_378._spanID = plVar11[3];
              local_378.super_SpanContext._vptr_SpanContext = (_func_int **)puVar1;
            }
            else {
              local_378._traceID._low = *puVar17;
              local_378.super_SpanContext._vptr_SpanContext = (_func_int **)*plVar11;
            }
            local_378._traceID._high = plVar11[1];
            *plVar11 = (long)puVar17;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_460,(key_type *)&local_378);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
LAB_0019222c:
              testing::Message::Message((Message *)&local_4d8);
              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                   )local_460._8_8_ !=
                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                   )0x0) {
                local_2b0 = *(char **)local_460._8_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_518,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x1cc,local_2b0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_518,(Message *)&local_4d8);
LAB_001920b3:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
              testing::Message::~Message((Message *)&local_4d8);
              p_Var20 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_460;
              goto LAB_001920cf;
            }
            testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
                      ((internal *)local_518,"\"test baggage item value\"",
                       "textMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")"
                       ,(char (*) [24])"test baggage item value",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)iVar10.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur + 0x28));
            if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
              operator_delete(local_378.super_SpanContext._vptr_SpanContext);
            }
            if (local_498._0_8_ != uVar8) {
              operator_delete((void *)local_498._0_8_);
            }
            if (local_518[0] == (Message)0x0) {
              testing::Message::Message((Message *)&local_378);
              if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_518._8_8_ ==
                  (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)0x0) {
                pp_Var21 = (__buckets_ptr)0x1e6ee4;
              }
              else {
                pp_Var21 = *(__buckets_ptr *)local_518._8_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_498,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x175,(char *)pp_Var21);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_498,(Message *)&local_378);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
              if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)0x0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') &&
                   (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)0x0)) {
                  (**(code **)(*local_378.super_SpanContext._vptr_SpanContext + 8))();
                }
                local_378.super_SpanContext._vptr_SpanContext = (_func_int **)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_518 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_00190a34:
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298);
              std::ios_base::~ios_base(local_228);
              goto LAB_00190a55;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_518 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_518._0_8_ = &PTR__TextMapReader_0020dea0;
            local_518._8_8_ =
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_460;
            (**(code **)((long)*(void **)uVar4 + 0x40))(local_498);
            local_4f0.has_value_ = (bool)local_498[0];
            local_4f0.contained.m_value._M_t.
            super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                 (value_type)
                 (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                  )0x0;
            if (local_498[0] == (Message)0x0) {
              testing::Message::Message((Message *)&local_3a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&local_378,&local_4f0.has_value_,
                         "static_cast<bool>(result)","false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_388,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x178,(char *)local_378.super_SpanContext._vptr_SpanContext);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_388,(Message *)&local_3a0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
              if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
                operator_delete(local_378.super_SpanContext._vptr_SpanContext);
              }
              if (local_3a0 != (undefined **)0x0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') && (local_3a0 != (undefined **)0x0)) {
                  (**(code **)(*local_3a0 + 8))();
                }
                local_3a0 = (undefined **)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_4f0.contained.m_value,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (local_498[0] != (Message)0x0) {
                if ((SpanContext *)local_498._8_8_ != (SpanContext *)0x0) {
                  (*((SpanContext *)local_498._8_8_)->_vptr_SpanContext[1])();
                }
                local_498._8_8_ = (SpanContext *)0x0;
              }
              goto LAB_00190a34;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_4f0.contained.m_value,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar8 = local_498._8_8_;
            if (local_498[0] == (Message)0x0) goto LAB_00191eb7;
            local_498._8_8_ = (SpanContext *)0x0;
            local_4f0.has_value_ = (SpanContext *)uVar8 != (SpanContext *)0x0;
            local_4f0.contained.m_value._M_t.
            super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                 (value_type)
                 (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                  )0x0;
            if ((SpanContext *)uVar8 == (SpanContext *)0x0) {
              testing::Message::Message((Message *)&local_3a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&local_378,&local_4f0.has_value_,
                         "static_cast<bool>(extractedCtx)","false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_388,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x17b,(char *)local_378.super_SpanContext._vptr_SpanContext);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_388,(Message *)&local_3a0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
              if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
                operator_delete(local_378.super_SpanContext._vptr_SpanContext);
              }
              testing::Message::~Message((Message *)&local_3a0);
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_4f0);
              cVar6 = '\0';
            }
            else {
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_4f0);
              pSVar9 = (SpanContext *)(*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
              testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                        ((internal *)&local_378,"span->context()","*extractedCtx",pSVar9,
                         (SpanContext *)uVar8);
              cVar6 = (char)local_378.super_SpanContext._vptr_SpanContext._0_1_;
              if (local_378.super_SpanContext._vptr_SpanContext._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_4f0);
                if ((SpanContext *)local_378._traceID._high == (SpanContext *)0x0) {
                  pp_Var22 = (_func_int **)0x1e6ee4;
                }
                else {
                  pp_Var22 = ((SpanContext *)local_378._traceID._high)->_vptr_SpanContext;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_3a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                           ,0x17c,(char *)pp_Var22);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_3a0,(Message *)&local_4f0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
                testing::Message::~Message((Message *)&local_4f0);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_378._traceID,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            if ((SpanContext *)uVar8 != (SpanContext *)0x0) {
              (*((SpanContext *)uVar8)->_vptr_SpanContext[1])(uVar8);
            }
            if (local_498[0] == (Message)0x1) {
              if ((SpanContext *)local_498._8_8_ != (SpanContext *)0x0) {
                (*((SpanContext *)local_498._8_8_)->_vptr_SpanContext[1])();
              }
              local_498._8_8_ = (SpanContext *)0x0;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298);
            std::ios_base::~ios_base(local_228);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_460);
            if (cVar6 == '\0') goto LAB_00190490;
            local_498._0_8_ = auStack_468;
            local_498._8_8_ = (SpanContext *)0x1;
            local_498._16_8_ = (__node_type *)0x0;
            local_498._24_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_478 = 1.0;
            local_470 = 0;
            auStack_468 = (undefined1  [8])0x0;
            local_3a0 = &PTR__TextMapWriter_0020ddd8;
            local_398 = local_498;
            uVar8 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
            (**(code **)((long)*(void **)uVar4 + 0x28))(&local_298,uVar4,uVar8,&local_3a0);
            local_460[0] = (internal)local_298.success_;
            local_460._8_8_ =
                 (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                  )0x0;
            if ((stringstream)local_298.success_ == (stringstream)0x0) {
              testing::Message::Message((Message *)&local_378);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_298,local_460,
                         "static_cast<bool>(tracer->Inject(span->context(), headerWriter))","false")
              ;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_4d8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                         ,0x184,(char *)local_298._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_4d8,(Message *)&local_378);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
              if ((void **)local_298._0_8_ != &local_288) {
                operator_delete((void *)local_298._0_8_);
              }
              testing::Message::~Message((Message *)&local_378);
              this_00 = (AssertionResult *)local_460;
LAB_00190f41:
              testing::AssertionResult::~AssertionResult(this_00);
            }
            else {
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
              local_378.super_SpanContext._vptr_SpanContext._0_4_ = 2;
              local_460._0_8_ = local_498._24_8_;
              testing::internal::CmpHelperEQ<int,unsigned_long>
                        ((internal *)&local_298,"2","headerMap.size()",(int *)&local_378,
                         (unsigned_long *)local_460);
              if ((stringstream)local_298.success_ == (stringstream)0x0) {
                testing::Message::Message((Message *)local_460);
                if (local_298.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar23 = "";
                }
                else {
                  pcVar23 = ((local_298.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_378,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                           ,0x185,pcVar23);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_378,(Message *)local_460);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_378);
                testing::Message::~Message((Message *)local_460);
                this_00 = &local_298;
                goto LAB_00190f41;
              }
              testing::AssertionResult::~AssertionResult(&local_298);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298);
              pSVar9 = (SpanContext *)(*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
              SpanContext::print<std::ostream>
                        (pSVar9,(basic_ostream<char,_std::char_traits<char>_> *)&local_298);
              std::__cxx11::stringbuf::str();
              local_378.super_SpanContext._vptr_SpanContext = (_func_int **)puVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_378,"uber-trace-id","");
              pmVar12 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_498,(key_type *)&local_378);
              testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                        ((internal *)&local_4d8,"oss.str()","headerMap.at(kTraceContextHeaderName)",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,pmVar12);
              if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
                operator_delete(local_378.super_SpanContext._vptr_SpanContext);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_460 + 0x10)) {
                operator_delete((void *)local_460._0_8_);
              }
              if ((char)local_4d8._M_buckets == '\0') {
                testing::Message::Message((Message *)local_460);
                if ((undefined8 *)local_4d8._M_bucket_count == (undefined8 *)0x0) {
                  pcVar23 = "";
                }
                else {
                  pcVar23 = *(char **)local_4d8._M_bucket_count;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_378,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                           ,0x188,pcVar23);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_378,(Message *)local_460);
LAB_00191b27:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_378);
                testing::Message::~Message((Message *)local_460);
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_4d8);
              }
              else {
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_4d8);
                local_378.super_SpanContext._vptr_SpanContext = (_func_int **)puVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"uberctx-","");
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_378);
                local_460._0_8_ = local_460 + 0x10;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 == paVar18) {
                  local_460._16_8_ = paVar18->_M_allocated_capacity;
                  local_460._24_8_ = plVar11[3];
                }
                else {
                  local_460._16_8_ = paVar18->_M_allocated_capacity;
                  local_460._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar11;
                }
                local_460._8_8_ =
                     ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                       *)(plVar11 + 1))->
                     super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                ;
                *plVar11 = (long)paVar18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                pmVar12 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_498,(key_type *)local_460);
                testing::internal::CmpHelperEQ<char[30],std::__cxx11::string>
                          ((internal *)&local_4d8,"\"test%20baggage%20item%20value\"",
                           "headerMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")"
                           ,(char (*) [30])"test%20baggage%20item%20value",pmVar12);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_460._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_460 + 0x10)) {
                  operator_delete((void *)local_460._0_8_);
                }
                if (local_378.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
                  operator_delete(local_378.super_SpanContext._vptr_SpanContext);
                }
                if ((char)local_4d8._M_buckets == '\0') {
                  testing::Message::Message((Message *)local_460);
                  if ((undefined8 *)local_4d8._M_bucket_count == (undefined8 *)0x0) {
                    pcVar23 = "";
                  }
                  else {
                    pcVar23 = *(char **)local_4d8._M_bucket_count;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_378,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                             ,0x18b,pcVar23);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_378,(Message *)local_460);
                  goto LAB_00191b27;
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_4d8);
                local_388 = &PTR__TextMapReader_0020de18;
                local_380 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_498;
                (**(code **)((long)*(void **)uVar4 + 0x48))(&local_4f0,uVar4);
                local_378.super_SpanContext._vptr_SpanContext._0_1_ = (internal)local_4f0.has_value_
                ;
                local_378._traceID._high = 0;
                if ((Message)local_4f0.has_value_ != (Message)0x0) {
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_378);
                  uVar8 = local_4f0.contained.m_value._M_t.
                          super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                          .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl
                  ;
                  if ((Message)local_4f0.has_value_ == (Message)0x0) goto LAB_00191eb7;
                  local_4f0.contained.m_value._M_t.
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                       (value_type)
                       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                        )0x0;
                  local_378.super_SpanContext._vptr_SpanContext._0_1_ =
                       (internal)((SpanContext *)uVar8 != (SpanContext *)0x0);
                  local_378._traceID._high = 0;
                  if ((SpanContext *)uVar8 == (SpanContext *)0x0) {
                    testing::Message::Message((Message *)&local_4d8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((AssertionResult *)local_460,(char *)&local_378,
                               "static_cast<bool>(extractedCtx)","false");
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_518,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                               ,0x191,(char *)local_460._0_8_);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_518,(Message *)&local_4d8);
LAB_00191c70:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_460._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_460 + 0x10)) {
                      operator_delete((void *)local_460._0_8_);
                    }
                    testing::Message::~Message((Message *)&local_4d8);
                    pSVar9 = &local_378;
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_378);
                    pSVar9 = (SpanContext *)(*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3)
                    ;
                    testing::internal::
                    CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                              ((internal *)local_460,"span->context()","*extractedCtx",pSVar9,
                               (SpanContext *)uVar8);
                    if (local_460[0] != (internal)0x0) {
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
                      std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)local_498);
                      local_460._0_8_ = local_460 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_460,"jaeger-debug-id","");
                      pmVar13 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)local_498,(key_type *)local_460);
                      std::__cxx11::string::operator=((string *)pmVar13,"yes");
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_460._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_460 + 0x10)) {
                        operator_delete((void *)local_460._0_8_);
                      }
                      uVar14 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                      (**(code **)((long)*(void **)uVar4 + 0x28))(local_f8,uVar4,uVar14,&local_3a0);
                      (**(code **)((long)*(void **)uVar4 + 0x48))(local_460,uVar4,&local_388);
                      opentracing::v3::
                      expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                      ::operator=(&local_4f0,
                                  (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                   *)local_460);
                      if (local_460[0] == (internal)0x1) {
                        if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                             )local_460._8_8_ !=
                            (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                             )0x0) {
                          (**(code **)(*(long *)local_460._8_8_ + 8))();
                        }
                        local_460._8_8_ =
                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                              )0x0;
                      }
                      local_378.super_SpanContext._vptr_SpanContext._0_1_ =
                           (internal)local_4f0.has_value_;
                      local_378._traceID._high = 0;
                      if ((Message)local_4f0.has_value_ == (Message)0x0) {
                        testing::Message::Message((Message *)&local_4d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((AssertionResult *)local_460,(char *)&local_378,
                                   "static_cast<bool>(result)","false");
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_518,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                   ,0x199,(char *)local_460._0_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_518,(Message *)&local_4d8);
                        goto LAB_00191c70;
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_378);
                      local_520._M_head_impl =
                           (SpanContext *)
                           local_4f0.contained.m_value._M_t.
                           super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                           .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                           _M_head_impl;
                      if ((Message)local_4f0.has_value_ == (Message)0x0) goto LAB_00191eb7;
                      local_4f0.contained.m_value._M_t.
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                           (value_type)
                           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                            )0x0;
                      (**(code **)(*(long *)uVar8 + 8))(uVar8);
                      local_378.super_SpanContext._vptr_SpanContext._0_1_ =
                           (internal)(local_520._M_head_impl != (SpanContext *)0x0);
                      local_378._traceID._high = 0;
                      if (local_520._M_head_impl == (SpanContext *)0x0) {
                        testing::Message::Message((Message *)&local_4d8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((AssertionResult *)local_460,(char *)&local_378,
                                   "static_cast<bool>(extractedCtx)","false");
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_518,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                   ,0x19b,(char *)local_460._0_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_518,(Message *)&local_4d8);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_460._0_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_460 + 0x10)) {
                          operator_delete((void *)local_460._0_8_);
                        }
                        testing::Message::~Message((Message *)&local_4d8);
                        pSVar9 = &local_378;
                      }
                      else {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_378);
                        pSVar9 = (SpanContext *)
                                 (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                        testing::internal::
                        CmpHelperNE<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                  ((internal *)local_460,"span->context()","*extractedCtx",pSVar9,
                                   (SpanContext *)local_520._M_head_impl);
                        if (local_460[0] != (internal)0x0) {
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
                          lVar15 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                          lVar16 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                          local_2c0 = *(uint64_t *)(lVar16 + 0x18);
                          lVar16 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                          local_2c8 = *(uint64_t *)(lVar16 + 0x20);
                          lVar16 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                          bVar2 = *(byte *)(lVar16 + 0x28);
                          lVar16 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                          local_460._0_8_ = local_460 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_460,"yes","");
                          SpanContext::SpanContext
                                    (&local_378,(TraceID *)(lVar15 + 8),local_2c0,local_2c8,
                                     bVar2 | 2,(StrMap *)(lVar16 + 0x30),(string *)local_460);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_460._0_8_ !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_460 + 0x10)) {
                            operator_delete((void *)local_460._0_8_);
                          }
                          testing::internal::
                          CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                    ((internal *)local_460,"ctx","*extractedCtx",&local_378,
                                     (SpanContext *)local_520._M_head_impl);
                          if (local_460[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_4d8);
                            if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                 )local_460._8_8_ ==
                                (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                 )0x0) {
                              pcVar23 = "";
                            }
                            else {
                              pcVar23 = *(char **)local_460._8_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_518,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                       ,0x1a5,pcVar23);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_518,(Message *)&local_4d8);
LAB_00191f9f:
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_518);
                            testing::Message::~Message((Message *)&local_4d8);
                            p_Var20 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                       *)local_460;
                          }
                          else {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_460)
                            ;
                            std::
                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     *)local_498);
                            local_460._0_8_ = local_460 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_460,"uber-trace-id","");
                            pmVar13 = std::__detail::
                                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)local_498,(key_type *)local_460);
                            std::__cxx11::string::operator=((string *)pmVar13,"12345678");
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_460._0_8_ !=
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(local_460 + 0x10)) {
                              operator_delete((void *)local_460._0_8_);
                            }
                            (**(code **)((long)*(void **)uVar4 + 0x48))(local_460,uVar4,&local_388);
                            opentracing::v3::
                            expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                            ::operator=(&local_4f0,
                                        (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                         *)local_460);
                            if (local_460[0] == (internal)0x1) {
                              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )local_460._8_8_ !=
                                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   )0x0) {
                                (**(code **)(*(long *)local_460._8_8_ + 8))();
                              }
                              local_460._8_8_ =
                                   (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                    )0x0;
                            }
                            local_4d8._M_buckets =
                                 (__buckets_ptr)
                                 CONCAT71(local_4d8._M_buckets._1_7_,local_4f0.has_value_);
                            local_4d8._M_bucket_count = 0;
                            if ((Message)local_4f0.has_value_ != (Message)0x0) {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_4d8);
                              uVar8 = local_4f0.contained.m_value._M_t.
                                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                      _M_head_impl;
                              if ((Message)local_4f0.has_value_ == (Message)0x0) {
LAB_00191eb7:
                                __assert_fail("has_value()",
                                              "/root/.hunter/_Base/d45d77d/2285c03/3b7ee27/Install/include/opentracing/expected/expected.hpp"
                                              ,0x28f,
                                              "value_type *opentracing::expected<std::unique_ptr<opentracing::SpanContext>>::operator->() [T = std::unique_ptr<opentracing::SpanContext>, E = std::error_code]"
                                             );
                              }
                              local_4f0.contained.m_value._M_t.
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (value_type)
                                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                              )0x0;
                              (**(code **)(*(long *)local_520._M_head_impl + 8))();
                              local_4d8._M_buckets = (__buckets_ptr)uVar8;
                              local_518._0_8_ = (SpanContext *)0x0;
                              testing::internal::
                              CmpHelperEQ<jaegertracing::SpanContext_const*,jaegertracing::SpanContext_const*>
                                        ((internal *)local_460,"nullptr","extractedCtx.get()",
                                         (SpanContext **)local_518,(SpanContext **)&local_4d8);
                              if (local_460[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_4d8);
                                if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )local_460._8_8_ ==
                                    (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                     )0x0) {
                                  pcVar23 = "";
                                }
                                else {
                                  pcVar23 = *(char **)local_460._8_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)local_518,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1ad,pcVar23);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)local_518,(Message *)&local_4d8);
                                goto LAB_001920b3;
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_460);
                              std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                       *)local_498);
                              (**(code **)((long)*(void **)uVar4 + 0x48))
                                        (local_460,uVar4,&local_388);
                              opentracing::v3::
                              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                              ::operator=(&local_4f0,
                                          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                           *)local_460);
                              if (local_460[0] == (internal)0x1) {
                                if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )local_460._8_8_ !=
                                    (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                     )0x0) {
                                  (**(code **)(*(long *)local_460._8_8_ + 8))();
                                }
                                local_460._8_8_ =
                                     (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                      )0x0;
                              }
                              local_4d8._M_buckets =
                                   (__buckets_ptr)
                                   CONCAT71(local_4d8._M_buckets._1_7_,local_4f0.has_value_);
                              local_4d8._M_bucket_count = 0;
                              if ((Message)local_4f0.has_value_ == (Message)0x0) {
                                testing::Message::Message((Message *)local_518);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((AssertionResult *)local_460,(char *)&local_4d8,
                                           "static_cast<bool>(result)","false");
                                testing::internal::AssertHelper::AssertHelper
                                          (local_4f8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1b2,(char *)local_460._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (local_4f8,(Message *)local_518);
                                goto LAB_0019204d;
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_4d8);
                              uVar14 = local_4f0.contained.m_value._M_t.
                                       super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                       .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                       ._M_head_impl;
                              if ((Message)local_4f0.has_value_ == (Message)0x0) goto LAB_00191eb7;
                              local_520._M_head_impl =
                                   (SpanContext *)
                                   local_4f0.contained.m_value._M_t.
                                   super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                   _M_head_impl;
                              local_4f0.contained.m_value._M_t.
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (value_type)
                                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                              )0x0;
                              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )uVar8 !=
                                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   )0x0) {
                                (*(*(_func_int ***)uVar8)[1])(uVar8);
                              }
                              local_4d8._M_buckets = (__buckets_ptr)uVar14;
                              local_518._0_8_ = (SpanContext *)0x0;
                              testing::internal::
                              CmpHelperEQ<jaegertracing::SpanContext_const*,jaegertracing::SpanContext_const*>
                                        ((internal *)local_460,"nullptr","extractedCtx.get()",
                                         (SpanContext **)local_518,(SpanContext **)&local_4d8);
                              if (local_460[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_4d8);
                                if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )local_460._8_8_ ==
                                    (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                     )0x0) {
                                  pcVar23 = "";
                                }
                                else {
                                  pcVar23 = *(char **)local_460._8_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)local_518,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1b4,pcVar23);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)local_518,(Message *)&local_4d8);
                                goto LAB_00191f9f;
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_460);
                              std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                       *)local_498);
                              lVar15 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                              lVar16 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                              local_2c0 = *(uint64_t *)(lVar16 + 0x18);
                              lVar16 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                              local_2c8 = *(uint64_t *)(lVar16 + 0x20);
                              lVar16 = (*(code *)(*(__node_base_ptr *)uVar3)[10]._M_nxt)(uVar3);
                              local_499 = *(uchar *)(lVar16 + 0x28);
                              std::
                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                        ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_460,(char (*) [2])0x1dfaa1,(char (*) [2])0x1d99bc)
                              ;
                              std::
                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                        (&local_420,(char (*) [2])0x1e2f28,(char (*) [2])0x1e43a7);
                              std::
                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                        (&local_3e0,(char (*) [2])0x1dcca0,(char (*) [2])0x1db317);
                              std::
                              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                              ::
                              _Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                          *)&local_4d8,local_460,&local_3a0,0,local_4f8,&local_389,
                                         &local_38a);
                              local_2b0 = "";
                              local_518._0_8_ = (SpanContext *)(local_518 + 0x10);
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_518,"");
                              SpanContext::SpanContext
                                        (&local_e0,(TraceID *)(lVar15 + 8),local_2c0,local_2c8,
                                         local_499,(StrMap *)&local_4d8,(string *)local_518);
                              SpanContext::swap(&local_378,&local_e0);
                              SpanContext::~SpanContext(&local_e0);
                              if ((SpanContext *)local_518._0_8_ !=
                                  (SpanContext *)(local_518 + 0x10)) {
                                operator_delete((void *)local_518._0_8_);
                              }
                              std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::~_Hashtable(&local_4d8);
                              lVar15 = 0x80;
                              do {
                                std::
                                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)(local_460 + lVar15));
                                lVar15 = lVar15 + -0x40;
                              } while (lVar15 != -0x40);
                              (**(code **)((long)*(void **)uVar4 + 0x28))
                                        (local_110,uVar4,&local_378,&local_3a0);
                              if ((__node_type *)local_498._16_8_ != (__node_type *)0x0) {
                                __it._M_cur = (__node_type *)local_498._16_8_;
                                do {
                                  std::__cxx11::string::substr
                                            ((ulong)local_460,(long)__it._M_cur + 8);
                                  iVar7 = std::__cxx11::string::compare(local_460);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_460._0_8_ !=
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)(local_460 + 0x10)) {
                                    operator_delete((void *)local_460._0_8_);
                                  }
                                  if (iVar7 == 0) {
                                    __it._M_cur = (__node_type *)
                                                  std::
                                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                                  ::erase((
                                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                                  *)local_498,__it._M_cur);
                                  }
                                  else {
                                    __it._M_cur = *__it._M_cur;
                                  }
                                } while (__it._M_cur != (__node_type *)0x0);
                              }
                              local_460._0_8_ = local_460 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_460,"jaeger-baggage","");
                              pmVar13 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)local_498,(key_type *)local_460);
                              std::__cxx11::string::operator=((string *)pmVar13,"a=x,b=y,c=z");
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_460._0_8_ !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(local_460 + 0x10)) {
                                operator_delete((void *)local_460._0_8_);
                              }
                              (**(code **)((long)*(void **)uVar4 + 0x48))
                                        (local_460,uVar4,&local_388);
                              opentracing::v3::
                              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                              ::operator=(&local_4f0,
                                          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                           *)local_460);
                              if (local_460[0] == (internal)0x1) {
                                if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )local_460._8_8_ !=
                                    (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                     )0x0) {
                                  (**(code **)(*(long *)local_460._8_8_ + 8))();
                                }
                                local_460._8_8_ =
                                     (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                      )0x0;
                              }
                              local_4d8._M_buckets =
                                   (__buckets_ptr)
                                   CONCAT71(local_4d8._M_buckets._1_7_,local_4f0.has_value_);
                              local_4d8._M_bucket_count = 0;
                              if ((Message)local_4f0.has_value_ == (Message)0x0) {
                                testing::Message::Message((Message *)local_518);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((AssertionResult *)local_460,(char *)&local_4d8,
                                           "static_cast<bool>(result)","false");
                                testing::internal::AssertHelper::AssertHelper
                                          (local_4f8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1c9,(char *)local_460._0_8_);
                                testing::internal::AssertHelper::operator=
                                          (local_4f8,(Message *)local_518);
                                goto LAB_00191f39;
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_4d8);
                              uVar8 = local_4f0.contained.m_value._M_t.
                                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                      _M_head_impl;
                              if ((Message)local_4f0.has_value_ == (Message)0x0) goto LAB_00191eb7;
                              local_4f0.contained.m_value._M_t.
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (value_type)
                                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                              )0x0;
                              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )uVar14 !=
                                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   )0x0) {
                                (*(*(_func_int ***)uVar14)[1])();
                              }
                              local_4d8._M_buckets =
                                   (__buckets_ptr)
                                   CONCAT71(local_4d8._M_buckets._1_7_,
                                            (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                             )uVar8 !=
                                            (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                             )0x0);
                              local_4d8._M_bucket_count = 0;
                              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )uVar8 ==
                                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   )0x0) goto LAB_001921b8;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_4d8);
                              local_518._0_4_ = 3;
                              local_4d8._M_buckets = *(__buckets_ptr *)(uVar8 + 0x48);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_460,"3","extractedCtx->baggage().size()",
                                         (int *)local_518,(unsigned_long *)&local_4d8);
                              if (local_460[0] == (internal)0x0) goto LAB_0019222c;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_460);
                              testing::internal::
                              CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                        ((internal *)local_460,"ctx","*extractedCtx",&local_378,
                                         (SpanContext *)uVar8);
                              iVar19 = local_460[0];
                              if (local_460[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_4d8);
                                if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )local_460._8_8_ ==
                                    (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                     )0x0) {
                                  pcVar23 = "";
                                }
                                else {
                                  pcVar23 = *(char **)local_460._8_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)local_518,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                           ,0x1cd,pcVar23);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)local_518,(Message *)&local_4d8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)local_518);
                                testing::Message::~Message((Message *)&local_4d8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_460);
                              local_520._M_head_impl = (SpanContext *)uVar8;
                              goto LAB_001920db;
                            }
                            testing::Message::Message((Message *)local_518);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((AssertionResult *)local_460,(char *)&local_4d8,
                                       "static_cast<bool>(result)","false");
                            testing::internal::AssertHelper::AssertHelper
                                      (local_4f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                       ,0x1ab,(char *)local_460._0_8_);
                            testing::internal::AssertHelper::operator=
                                      (local_4f8,(Message *)local_518);
LAB_00191f39:
                            testing::internal::AssertHelper::~AssertHelper(local_4f8);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_460._0_8_ !=
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(local_460 + 0x10)) {
                              operator_delete((void *)local_460._0_8_);
                            }
                            testing::Message::~Message((Message *)local_518);
                            p_Var20 = &local_4d8;
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)p_Var20);
                          iVar19 = (internal)0x0;
                          goto LAB_001920db;
                        }
                        testing::Message::Message((Message *)&local_378);
                        if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                             )local_460._8_8_ ==
                            (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                             )0x0) {
                          pcVar23 = "";
                        }
                        else {
                          pcVar23 = *(char **)local_460._8_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_4d8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                                   ,0x19c,pcVar23);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_4d8,(Message *)&local_378);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
                        testing::Message::~Message((Message *)&local_378);
                        pSVar9 = (SpanContext *)local_460;
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)pSVar9);
                      iVar19 = (internal)0x0;
                      goto LAB_00191d02;
                    }
                    testing::Message::Message((Message *)&local_378);
                    if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                         )local_460._8_8_ ==
                        (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                         )0x0) {
                      pcVar23 = "";
                    }
                    else {
                      pcVar23 = *(char **)local_460._8_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_4d8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                               ,0x192,pcVar23);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_4d8,(Message *)&local_378);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
                    testing::Message::~Message((Message *)&local_378);
                    pSVar9 = (SpanContext *)local_460;
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)pSVar9);
                  iVar19 = (internal)0x0;
                  local_520._M_head_impl = (SpanContext *)uVar8;
                  goto LAB_00191d02;
                }
                testing::Message::Message((Message *)&local_4d8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((AssertionResult *)local_460,(char *)&local_378,
                           "static_cast<bool>(result)","false");
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_518,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                           ,0x18e,(char *)local_460._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_518,(Message *)&local_4d8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_460._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_460 + 0x10)) {
                  operator_delete((void *)local_460._0_8_);
                }
                testing::Message::~Message((Message *)&local_4d8);
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_378);
                if ((Message)local_4f0.has_value_ != (Message)0x0) {
                  if (local_4f0.contained.m_value._M_t.
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
                      (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                       )0x0) {
                    (*(*(_func_int ***)
                        local_4f0.contained.m_value._M_t.
                        super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                        .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl)
                      [1])();
                  }
                  local_4f0.contained.m_value._M_t.
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                       (value_type)
                       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                        )0x0;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298);
              std::ios_base::~ios_base(local_228);
            }
            p_Var20 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_498;
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(p_Var20);
          goto LAB_00190490;
        }
        testing::Message::Message((Message *)local_498);
        if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
             )local_460._8_8_ ==
            (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
             )0x0) {
          pcVar23 = "";
        }
        else {
          pcVar23 = *(char **)local_460._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                   ,0x162,pcVar23);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)local_498);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
        if ((SpanContext *)local_498._0_8_ != (SpanContext *)0x0) {
          cVar6 = testing::internal::IsTrue(true);
          if ((cVar6 != '\0') && ((SpanContext *)local_498._0_8_ != (SpanContext *)0x0)) {
            (**(code **)(*(long *)local_498._0_8_ + 8))();
          }
          local_498._0_8_ = (SpanContext *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_460 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      if ((SpanContext *)rhs != (SpanContext *)0x0) {
        (*((SpanContext *)rhs)->_vptr_SpanContext[1])(rhs);
      }
      if (local_378.super_SpanContext._vptr_SpanContext._0_1_ != (internal)0x1) goto LAB_0019046f;
    }
    if ((SpanContext *)local_378._traceID._high != (SpanContext *)0x0) {
      (*((SpanContext *)local_378._traceID._high)->_vptr_SpanContext[1])();
    }
    local_378._traceID._high = 0;
  }
LAB_0019046f:
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_298);
  std::ios_base::~ios_base(local_218);
LAB_00190490:
  if ((__buckets_ptr)uVar3 != (__buckets_ptr)0x0) {
    (*(code *)(*(__node_base_ptr *)uVar3)[1]._M_nxt)(uVar3);
  }
  if (local_2b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8);
  }
  if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
  }
  return;
}

Assistant:

TEST(Tracer, testPropagation)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    const std::unique_ptr<Span> span(static_cast<Span*>(
        tracer->StartSpanWithOptions("test-inject", {}).release()));
    span->SetBaggageItem("test-baggage-item-key", "test baggage item value");

    // Binary
    {
        std::stringstream ss;
        ASSERT_TRUE(static_cast<bool>(tracer->Inject(span->context(), ss)));
        auto result = tracer->Extract(ss);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
        FakeSpanContext fakeCtx;
        ss.clear();
        ss.str("");
        ASSERT_FALSE(static_cast<bool>(tracer->Inject(fakeCtx, ss)));
    }

    // Text map
    {
        StrMap textMap;
        WriterMock<opentracing::TextMapWriter> textWriter(textMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), textWriter)));
        ASSERT_EQ(2, textMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), textMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test baggage item value",
                  textMap.at(std::string(kTraceBaggageHeaderPrefix) +
                             "test-baggage-item-key"));
        ReaderMock<opentracing::TextMapReader> textReader(textMap);
        auto result = tracer->Extract(textReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
    }

    // HTTP map
    {
        StrMap headerMap;
        WriterMock<opentracing::HTTPHeadersWriter> headerWriter(headerMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), headerWriter)));
        ASSERT_EQ(2, headerMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), headerMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test%20baggage%20item%20value",
                  headerMap.at(std::string(kTraceBaggageHeaderPrefix) +
                               "test-baggage-item-key"));
        ReaderMock<opentracing::HTTPHeadersReader> headerReader(headerMap);
        auto result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);

        // Test debug header.
        headerMap.clear();
        headerMap[kJaegerDebugHeader] = "yes";
        tracer->Inject(span->context(), headerWriter);
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_NE(span->context(), *extractedCtx);
        SpanContext ctx(
            span->context().traceID(),
            span->context().spanID(),
            span->context().parentID(),
            span->context().flags() |
                static_cast<unsigned char>(SpanContext::Flag::kDebug),
            span->context().baggage(),
            "yes");
        ASSERT_EQ(ctx, *extractedCtx);

        // Test bad trace context.
        headerMap.clear();
        headerMap[kTraceContextHeaderName] = "12345678";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test empty map.
        headerMap.clear();
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test alternative baggage format.
        headerMap.clear();
        ctx = SpanContext(span->context().traceID(),
                          span->context().spanID(),
                          span->context().parentID(),
                          span->context().flags(),
                          { { "a", "x" }, { "b", "y" }, { "c", "z" } });
        tracer->Inject(ctx, headerWriter);
        for (auto itr = std::begin(headerMap); itr != std::end(headerMap);) {
            if (itr->first.substr(0, std::strlen(kTraceBaggageHeaderPrefix)) ==
                kTraceBaggageHeaderPrefix) {
                itr = headerMap.erase(itr);
            }
            else {
                ++itr;
            }
        }
        headerMap[kJaegerBaggageHeader] = "a=x,b=y,c=z";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(3, extractedCtx->baggage().size());
        ASSERT_EQ(ctx, *extractedCtx);
    }
    tracer->Close();
}